

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_NearestNeighbors_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003c7fe0 == '\x01') {
    DAT_003c7fe0 = '\0';
    (*(code *)*_KNearestNeighborsClassifier_default_instance_)();
  }
  if (DAT_003c8068 == '\x01') {
    DAT_003c8068 = '\0';
    (*(code *)*_NearestNeighborsIndex_default_instance_)();
  }
  if (DAT_003c80a0 == '\x01') {
    DAT_003c80a0 = '\0';
    (*(code *)*_UniformWeighting_default_instance_)();
  }
  if (DAT_003c80c0 == '\x01') {
    DAT_003c80c0 = '\0';
    (*(code *)*_InverseDistanceWeighting_default_instance_)();
  }
  if (DAT_003c80e0 == '\x01') {
    DAT_003c80e0 = '\0';
    (*(code *)*_LinearIndex_default_instance_)();
  }
  if (DAT_003c8100 == '\x01') {
    DAT_003c8100 = '\0';
    (*(code *)*_SingleKdTreeIndex_default_instance_)();
  }
  if (DAT_003c8120 == '\x01') {
    DAT_003c8120 = 0;
    (*(code *)*_SquaredEuclideanDistance_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _KNearestNeighborsClassifier_default_instance_.Shutdown();
  _NearestNeighborsIndex_default_instance_.Shutdown();
  _UniformWeighting_default_instance_.Shutdown();
  _InverseDistanceWeighting_default_instance_.Shutdown();
  _LinearIndex_default_instance_.Shutdown();
  _SingleKdTreeIndex_default_instance_.Shutdown();
  _SquaredEuclideanDistance_default_instance_.Shutdown();
}